

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trees.c
# Opt level: O3

void compress_block(deflate_state *s,ct_data *ltree,ct_data *dtree)

{
  byte bVar1;
  Bytef BVar2;
  ushort uVar3;
  ushort uVar4;
  int iVar5;
  uchf *puVar6;
  ulg uVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  ushort uVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  uint uVar15;
  
  if (s->sym_next == 0) {
    iVar10 = s->bi_valid;
  }
  else {
    uVar9 = 0;
    do {
      puVar6 = s->sym_buf;
      uVar15 = (uint)CONCAT11(puVar6[uVar9 + 1],puVar6[uVar9]);
      bVar1 = puVar6[uVar9 + 2];
      if (uVar15 == 0) {
        uVar3 = ltree[bVar1].dl.dad;
        iVar10 = s->bi_valid;
        uVar4 = ltree[bVar1].fc.freq;
        uVar11 = uVar4 << ((byte)iVar10 & 0x1f) | s->bi_buf;
        s->bi_buf = uVar11;
        if ((int)(0x10 - (uint)uVar3) < iVar10) {
          uVar7 = s->pending;
          s->pending = uVar7 + 1;
          s->pending_buf[uVar7] = (Bytef)uVar11;
          BVar2 = *(Bytef *)((long)&s->bi_buf + 1);
          uVar7 = s->pending;
          s->pending = uVar7 + 1;
          s->pending_buf[uVar7] = BVar2;
          s->bi_buf = uVar4 >> (0x10U - (char)s->bi_valid & 0x1f);
          iVar10 = (uint)uVar3 + s->bi_valid + -0x10;
        }
        else {
          iVar10 = iVar10 + (uint)uVar3;
        }
LAB_0015c47c:
        s->bi_valid = iVar10;
      }
      else {
        uVar14 = (ulong)""[bVar1];
        uVar3 = ltree[uVar14 + 0x101].dl.dad;
        iVar10 = s->bi_valid;
        uVar4 = ltree[uVar14 + 0x101].fc.freq;
        uVar11 = uVar4 << ((byte)iVar10 & 0x1f) | s->bi_buf;
        s->bi_buf = uVar11;
        if ((int)(0x10 - (uint)uVar3) < iVar10) {
          uVar7 = s->pending;
          s->pending = uVar7 + 1;
          s->pending_buf[uVar7] = (Bytef)uVar11;
          BVar2 = *(Bytef *)((long)&s->bi_buf + 1);
          uVar7 = s->pending;
          s->pending = uVar7 + 1;
          s->pending_buf[uVar7] = BVar2;
          uVar11 = uVar4 >> (0x10U - (char)s->bi_valid & 0x1f);
          s->bi_buf = uVar11;
          iVar10 = (uint)uVar3 + s->bi_valid + -0x10;
        }
        else {
          iVar10 = iVar10 + (uint)uVar3;
        }
        uVar12 = (uint)uVar11;
        s->bi_valid = iVar10;
        if (0xffffffffffffffeb < uVar14 - 0x1c) {
          uVar13 = (uint)bVar1 - base_length[uVar14];
          iVar5 = extra_lbits[uVar14];
          if (0x10 - iVar5 < iVar10) {
            uVar12 = uVar12 | uVar13 << ((byte)iVar10 & 0x1f);
            s->bi_buf = (ush)uVar12;
            uVar7 = s->pending;
            s->pending = uVar7 + 1;
            s->pending_buf[uVar7] = (Bytef)uVar12;
            BVar2 = *(Bytef *)((long)&s->bi_buf + 1);
            uVar7 = s->pending;
            s->pending = uVar7 + 1;
            s->pending_buf[uVar7] = BVar2;
            uVar12 = (uVar13 & 0xffff) >> (0x10U - (char)s->bi_valid & 0x1f);
            s->bi_buf = (ush)uVar12;
            iVar10 = s->bi_valid + iVar5 + -0x10;
          }
          else {
            uVar12 = uVar12 | uVar13 << ((byte)iVar10 & 0x1f);
            s->bi_buf = (ush)uVar12;
            iVar10 = iVar5 + iVar10;
          }
          s->bi_valid = iVar10;
        }
        uVar13 = uVar15 - 1;
        uVar8 = (uVar13 >> 7) + 0x100;
        if (uVar15 < 0x101) {
          uVar8 = uVar13;
        }
        bVar1 = ""[uVar8];
        uVar3 = dtree[bVar1].dl.dad;
        uVar4 = dtree[bVar1].fc.freq;
        uVar12 = uVar12 | (uint)uVar4 << ((byte)iVar10 & 0x1f);
        s->bi_buf = (ush)uVar12;
        if ((int)(0x10 - (uint)uVar3) < iVar10) {
          uVar7 = s->pending;
          s->pending = uVar7 + 1;
          s->pending_buf[uVar7] = (Bytef)uVar12;
          BVar2 = *(Bytef *)((long)&s->bi_buf + 1);
          uVar7 = s->pending;
          s->pending = uVar7 + 1;
          s->pending_buf[uVar7] = BVar2;
          uVar4 = uVar4 >> (0x10U - (char)s->bi_valid & 0x1f);
          s->bi_buf = uVar4;
          iVar10 = s->bi_valid + (uint)uVar3 + -0x10;
          uVar12 = (uint)uVar4;
        }
        else {
          iVar10 = iVar10 + (uint)uVar3;
        }
        s->bi_valid = iVar10;
        if (3 < bVar1) {
          uVar13 = uVar13 - base_dist[bVar1];
          iVar5 = extra_dbits[bVar1];
          if (0x10 - iVar5 < iVar10) {
            uVar12 = uVar12 | uVar13 << ((byte)iVar10 & 0x1f);
            s->bi_buf = (ush)uVar12;
            uVar7 = s->pending;
            s->pending = uVar7 + 1;
            s->pending_buf[uVar7] = (Bytef)uVar12;
            BVar2 = *(Bytef *)((long)&s->bi_buf + 1);
            uVar7 = s->pending;
            s->pending = uVar7 + 1;
            s->pending_buf[uVar7] = BVar2;
            s->bi_buf = (ush)((uVar13 & 0xffff) >> (0x10U - (char)s->bi_valid & 0x1f));
            iVar10 = iVar5 + s->bi_valid + -0x10;
          }
          else {
            s->bi_buf = (ushort)uVar12 | (ushort)(uVar13 << ((byte)iVar10 & 0x1f));
            iVar10 = iVar5 + iVar10;
          }
          goto LAB_0015c47c;
        }
      }
      uVar9 = uVar9 + 3;
    } while (uVar9 < s->sym_next);
  }
  uVar3 = ltree[0x100].dl.dad;
  uVar4 = ltree[0x100].fc.freq;
  uVar11 = uVar4 << ((byte)iVar10 & 0x1f) | s->bi_buf;
  s->bi_buf = uVar11;
  if ((int)(0x10 - (uint)uVar3) < iVar10) {
    uVar7 = s->pending;
    s->pending = uVar7 + 1;
    s->pending_buf[uVar7] = (Bytef)uVar11;
    BVar2 = *(Bytef *)((long)&s->bi_buf + 1);
    uVar7 = s->pending;
    s->pending = uVar7 + 1;
    s->pending_buf[uVar7] = BVar2;
    s->bi_buf = uVar4 >> (0x10U - (char)s->bi_valid & 0x1f);
    iVar10 = (uint)uVar3 + s->bi_valid + -0x10;
  }
  else {
    iVar10 = iVar10 + (uint)uVar3;
  }
  s->bi_valid = iVar10;
  return;
}

Assistant:

local void compress_block(deflate_state *s, const ct_data *ltree,
                          const ct_data *dtree) {
    unsigned dist;      /* distance of matched string */
    int lc;             /* match length or unmatched char (if dist == 0) */
    unsigned sx = 0;    /* running index in symbol buffers */
    unsigned code;      /* the code to send */
    int extra;          /* number of extra bits to send */

    if (s->sym_next != 0) do {
#ifdef LIT_MEM
        dist = s->d_buf[sx];
        lc = s->l_buf[sx++];
#else
        dist = s->sym_buf[sx++] & 0xff;
        dist += (unsigned)(s->sym_buf[sx++] & 0xff) << 8;
        lc = s->sym_buf[sx++];
#endif
        if (dist == 0) {
            send_code(s, lc, ltree); /* send a literal byte */
            Tracecv(isgraph(lc), (stderr," '%c' ", lc));
        } else {
            /* Here, lc is the match length - MIN_MATCH */
            code = _length_code[lc];
            send_code(s, code + LITERALS + 1, ltree);   /* send length code */
            extra = extra_lbits[code];
            if (extra != 0) {
                lc -= base_length[code];
                send_bits(s, lc, extra);       /* send the extra length bits */
            }
            dist--; /* dist is now the match distance - 1 */
            code = d_code(dist);
            Assert (code < D_CODES, "bad d_code");

            send_code(s, code, dtree);       /* send the distance code */
            extra = extra_dbits[code];
            if (extra != 0) {
                dist -= (unsigned)base_dist[code];
                send_bits(s, dist, extra);   /* send the extra distance bits */
            }
        } /* literal or match pair ? */

        /* Check for no overlay of pending_buf on needed symbols */
#ifdef LIT_MEM
        Assert(s->pending < 2 * (s->lit_bufsize + sx), "pendingBuf overflow");
#else
        Assert(s->pending < s->lit_bufsize + sx, "pendingBuf overflow");
#endif

    } while (sx < s->sym_next);

    send_code(s, END_BLOCK, ltree);
}